

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PushPopTest.cpp
# Opt level: O0

void __thiscall
PushPopTest_SortTimeMeasurement_Test::PushPopTest_SortTimeMeasurement_Test
          (PushPopTest_SortTimeMeasurement_Test *this)

{
  undefined8 *in_RDI;
  
  PushPopTest::PushPopTest(&this->super_PushPopTest);
  *in_RDI = &PTR__PushPopTest_SortTimeMeasurement_Test_001ce7e0;
  in_RDI[2] = &PTR__PushPopTest_SortTimeMeasurement_Test_001ce820;
  return;
}

Assistant:

TEST_P(PushPopTest, SortTimeMeasurement) {
    std::size_t n = GetParam();

    resetRandom();
    MEASURE_TIME_BEGIN(stdDequeMs);
    for (std::size_t i = 0; i < n; ++i) {
        int x = nextRandom();
        stdDeque.push_back(x);
        int y = nextRandom();
        stdDeque.push_front(y);
    }

    std::sort(stdDeque.begin(), stdDeque.end());
    MEASURE_TIME_END(stdDequeMs);

    resetRandom();
    MEASURE_TIME_BEGIN(myDequeMs);
    for (std::size_t i = 0; i < n; ++i) {
        int x = nextRandom();
        myDeque.push_back(x);
        int y = nextRandom();
        myDeque.push_front(y);
    }

    std::sort(myDeque.begin(), myDeque.end());
    MEASURE_TIME_END(myDequeMs);

    auto p = std::mismatch(myDeque.begin(), myDeque.end(), stdDeque.begin());
    ASSERT_EQ(p.first, myDeque.end());

    std::cout   << "std::deque time: " << stdDequeMs << " ms." << std::endl
                << "My Deque time: " << myDequeMs << " ms." << std::endl;

}